

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
::runSample(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            *this,SampleResult *sample)

{
  int iVar1;
  DrawMethod DVar2;
  BufferState BVar3;
  UploadRange UVar4;
  UploadMethod UVar5;
  RenderContext *context;
  char cVar6;
  int iVar7;
  deUint32 err;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *__dest;
  deUint64 dVar11;
  deUint64 dVar12;
  Exception *this_00;
  undefined8 *puVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  pointer __src;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  Surface resultSurface;
  Buffer vertexCopyBuffer;
  Buffer arrayBuffer;
  Buffer unrelatedBuffer;
  Buffer indexBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  Surface local_c8;
  undefined1 local_b0 [40];
  deUint64 local_88;
  TextureFormat local_80;
  ObjectWrapper local_78;
  ObjectWrapper local_60;
  ObjectWrapper local_48;
  long lVar9;
  
  iVar7 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_78,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar10);
  iVar7 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar10);
  iVar7 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_60,(Functions *)CONCAT44(extraout_var_02,iVar7),pOVar10);
  iVar7 = (sample->scene).gridWidth;
  iVar8 = (sample->scene).gridHeight;
  iVar1 = (sample->scene).gridLayers;
  tcu::Surface::Surface(&local_c8,0x80,0x80);
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  generateLayeredGridVertexAttribData4C4V(&local_108,&sample->scene);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData(&local_e8,&sample->scene);
  }
  (**(code **)(lVar9 + 0x40))(0x8892,local_78.m_object);
  (**(code **)(lVar9 + 0x40))(0x8893,local_48.m_object);
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  iVar7 = iVar7 * iVar8 * iVar1 * 6;
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  BVar3 = this->m_bufferState;
  uVar14 = 0x88e8;
  if (DVar2 == DRAWMETHOD_DRAW_ARRAYS && (BVar3 ^ BUFFERSTATE_EXISTING) == BUFFERSTATE_NEW) {
LAB_00749f46:
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)local_108.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               local_108.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar14);
    (**(code **)(lVar9 + 0x538))(4,0,iVar7);
  }
  else if (DVar2 != DRAWMETHOD_DRAW_ARRAYS || BVar3 != BUFFERSTATE_NEW) {
    if ((BVar3 ^ BUFFERSTATE_EXISTING) == BUFFERSTATE_NEW &&
        (DVar2 ^ DRAWMETHOD_DRAW_ELEMENTS) == DRAWMETHOD_DRAW_ARRAYS) {
      iVar8 = *(int *)&(this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                       ).field_0xcc;
      (**(code **)(lVar9 + 0x150))
                (0x8892,(long)local_108.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_108.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                 local_108.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,(uint)(iVar8 == 0) * 4 + 0x88e4);
      (**(code **)(lVar9 + 0x150))
                (0x8893,(long)local_e8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,(uint)(iVar8 == 1) * 4 + 0x88e4);
      (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
    }
    else if ((DVar2 ^ DRAWMETHOD_DRAW_ELEMENTS) == DRAWMETHOD_DRAW_ARRAYS &&
             BVar3 == BUFFERSTATE_NEW) {
      iVar8 = *(int *)&(this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                       ).field_0xcc;
      if (iVar8 == 1) {
        uVar14 = 0x88e4;
        goto LAB_00749f46;
      }
      if (iVar8 == 0) {
        iVar8 = (*((this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                   ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
        glu::ObjectWrapper::ObjectWrapper
                  ((ObjectWrapper *)local_b0,(Functions *)CONCAT44(extraout_var_03,iVar8),pOVar10);
        (**(code **)(lVar9 + 0x40))(0x8892,local_b0._16_4_);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        (**(code **)(lVar9 + 0x150))
                  (0x8892,(long)local_108.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_108.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                   local_108.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar9 + 0x150))
                  (0x8893,(long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                   local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
        (**(code **)(lVar9 + 0x40))(0x8892,local_78.m_object);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_b0);
      }
    }
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  err = (**(code **)(lVar9 + 0x800))();
  glu::checkError(err,"post buffer prepare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1323);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  uVar15 = *(uint *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                     ).field_0xcc;
  UVar4 = this->m_uploadRange;
  if (uVar15 == 0 && UVar4 == UPLOADRANGE_FULL) {
    lVar17 = (long)local_108.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = 0x8892;
    __src = local_108.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
LAB_0074a181:
    lVar16 = 0;
  }
  else {
    if ((uVar15 ^ 1) == 0 && UVar4 == UPLOADRANGE_FULL) {
      lVar17 = (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar14 = 0x8893;
      __src = (pointer)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0074a181;
    }
    if (uVar15 == 0 && (UVar4 ^ UPLOADRANGE_PARTIAL) == UPLOADRANGE_FULL) {
      iVar8 = (int)local_108.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
              (int)local_108.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = (long)(int)(iVar8 >> 1 & 0xfffffff8);
      lVar16 = (long)(int)(iVar8 >> 2 & 0xfffffffc);
      __src = (pointer)((long)(local_108.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      uVar14 = 0x8892;
    }
    else {
      if ((uVar15 ^ 1) != 0 || (UVar4 ^ UPLOADRANGE_PARTIAL) != UPLOADRANGE_FULL) goto LAB_0074a3df;
      uVar15 = ((int)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
                (int)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffeU) + 3 & 0xfffffffc;
      lVar17 = (long)(int)uVar15;
      lVar16 = (long)(int)(((int)uVar15 >> 1) + 3U & 0xfffffffc);
      __src = (pointer)((long)(float *)local_e8.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar16);
      uVar14 = 0x8893;
    }
  }
  local_88 = deGetMicroseconds();
  UVar5 = this->m_uploadMethod;
  if (UVar5 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar9 + 0x150))(uVar14,lVar17,0,0x88e8);
    }
    __dest = (void *)(**(code **)(lVar9 + 0xd00))(uVar14,lVar16,lVar17,0x2e);
    if (__dest == (void *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      local_b0._0_8_ = (long)local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"MapBufferRange returned NULL","");
      tcu::Exception::Exception(this_00,(string *)local_b0);
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    memcpy(__dest,__src,(long)(int)lVar17);
    cVar6 = (**(code **)(lVar9 + 0x1670))(uVar14);
    if (cVar6 == '\0') {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = &PTR__exception_00d164f8;
      __cxa_throw(puVar13,&(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
  }
  else if (UVar5 == UPLOADMETHOD_BUFFER_SUB_DATA) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar9 + 0x150))(uVar14,lVar17,0,0x88e8);
    }
    (**(code **)(lVar9 + 0x168))(uVar14,lVar16,lVar17,__src);
  }
  else if (UVar5 == UPLOADMETHOD_BUFFER_DATA) {
    (**(code **)(lVar9 + 0x150))(uVar14,lVar17,__src,0x88e8);
  }
  dVar11 = deGetMicroseconds();
  (sample->result).uploadedDataSize = (int)lVar17;
  (sample->result).duration.uploadDuration = dVar11 - local_88;
  if (this->m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) {
    uVar15 = (int)local_108.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
             (int)local_108.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar9 + 0x40))(0x8892,local_60.m_object);
    uVar15 = uVar15 & 0xfffffff0;
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)(int)uVar15,
               local_108.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    (sample->result).unrelatedDataSize = uVar15;
  }
  dVar11 = deGetMicroseconds();
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar2 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
  }
  else if (DVar2 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar9 + 0x538))(4,0,iVar7);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.renderDuration = dVar12 - dVar11;
  dVar11 = deGetMicroseconds();
  context = ((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx;
  local_80.order = RGBA;
  local_80.type = UNORM_INT8;
  if ((void *)local_c8.m_pixels.m_cap != (void *)0x0) {
    local_c8.m_pixels.m_cap = (size_t)local_c8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_b0,&local_80,local_c8.m_width,local_c8.m_height,1,
             (void *)local_c8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_b0);
  dVar12 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar12 - dVar11;
  (sample->result).renderDataSize = (sample->result).numVertices << 5;
  dVar11 = (dVar12 - dVar11) + (sample->result).duration.renderDuration;
  (sample->result).duration.renderReadDuration = dVar11;
  (sample->result).duration.totalDuration = (sample->result).duration.uploadDuration + dVar11;
  (sample->result).duration.fitResponseDuration = dVar11;
LAB_0074a3df:
  if ((pointer)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_c8);
  glu::ObjectWrapper::~ObjectWrapper(&local_60);
  glu::ObjectWrapper::~ObjectWrapper(&local_48);
  glu::ObjectWrapper::~ObjectWrapper(&local_78);
  return;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::runSample (SampleResult& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glu::Buffer		arrayBuffer			(m_context.getRenderContext());
	const glu::Buffer		indexBuffer			(m_context.getRenderContext());
	const glu::Buffer		unrelatedBuffer		(m_context.getRenderContext());
	const int				numVertices			= getLayeredGridNumVertices(sample.scene);
	tcu::Surface			resultSurface		(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	deUint64				startTime;
	deUint64				endTime;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;

	// create data

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		generateLayeredGridIndexData(indexData, sample.scene);

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
	RenderCase<SampleType>::setupVertexAttribs();

	// target should be an exisiting buffer? Draw from it once to make sure it exists on the gpu

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_NEW)
	{
		// do not touch the vertex buffer
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		// hint that the target buffer will be modified soon
		const glw::GLenum vertexDataUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexDataUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], vertexDataUsage);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], indexDataUsage);
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_targetBuffer == TARGETBUFFER_VERTEX)
		{
			// make the index buffer present on the gpu
			// use another vertex buffer to keep original buffer in unused state
			const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

			gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
			RenderCase<SampleType>::setupVertexAttribs();

			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);

			// restore original state
			gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
			RenderCase<SampleType>::setupVertexAttribs();
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX)
		{
			// make the vertex buffer present on the gpu
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		}
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	RenderCase<SampleType>::waitGLResults();
	GLU_EXPECT_NO_ERROR(gl.getError(), "post buffer prepare");

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	RenderCase<SampleType>::waitGLResults();

	tcu::warmupCPU();

	// upload

	{
		glw::GLenum		target;
		glw::GLsizeiptr	size;
		glw::GLintptr	offset = 0;
		const void*		source;

		if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4));
			source	= &vertexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32));
			source	= &indexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((int)(vertexData.size() * sizeof(tcu::Vec4)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&vertexData[0] + offset;
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			// upload to 25% - 75% range
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((deInt32)(indexData.size() * sizeof(deUint32)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&indexData[0] + offset;
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		startTime = deGetMicroseconds();

		if (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)
			gl.bufferData(target, size, source, GL_DYNAMIC_DRAW);
		else if (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
		{
			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);
			gl.bufferSubData(target, offset, size, source);
		}
		else if (m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
		{
			void*			mapPtr;
			glw::GLboolean	unmapSuccessful;

			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);

			mapPtr = gl.mapBufferRange(target, offset, size, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT);
			if (!mapPtr)
				throw tcu::Exception("MapBufferRange returned NULL");

			deMemcpy(mapPtr, source, (int)size);

			// if unmapping fails, just try again later
			unmapSuccessful = gl.unmapBuffer(target);
			if (!unmapSuccessful)
				throw UnmapFailureError();
		}
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.uploadedDataSize = (int)size;
		sample.result.duration.uploadDuration = endTime - startTime;
	}

	// unrelated
	if (m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX)
	{
		const int unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, &vertexData[0], GL_STATIC_DRAW);
		// Attibute pointers are not modified, no need restore state

		sample.result.unrelatedDataSize = unrelatedUploadSize;
	}

	// draw
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	// read
	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	// set results

	sample.result.renderDataSize = RenderCase<SampleType>::getVertexDataSize() * sample.result.numVertices;

	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.uploadDuration + sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}